

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wasm-ctor-eval.cpp
# Opt level: O0

bool anon_unknown.dwarf_65694::isNullableAndMutable(Expression *ref,Index fieldIndex)

{
  bool bVar1;
  Field *pFVar2;
  bool local_39;
  undefined1 local_30 [8];
  optional<wasm::Field> field;
  Index fieldIndex_local;
  Expression *ref_local;
  
  field.super__Optional_base<wasm::Field,_true,_true>._M_payload.
  super__Optional_payload_base<wasm::Field>._20_4_ = fieldIndex;
  ::wasm::GCTypeUtils::getField((optional<wasm::Field> *)local_30,(Type)(ref->type).id,fieldIndex);
  bVar1 = std::optional::operator_cast_to_bool((optional *)local_30);
  if (bVar1) {
    pFVar2 = std::optional<wasm::Field>::operator->((optional<wasm::Field> *)local_30);
    bVar1 = ::wasm::Type::isNullable((Type *)pFVar2);
    local_39 = false;
    if (bVar1) {
      pFVar2 = std::optional<wasm::Field>::operator->((optional<wasm::Field> *)local_30);
      local_39 = *(int *)(pFVar2 + 0xc) == 1;
    }
    return local_39;
  }
  __assert_fail("field",
                "/workspace/llm4binary/github/license_c_cmakelists/WebAssembly[P]binaryen/src/tools/wasm-ctor-eval.cpp"
                ,0x3e,"bool (anonymous namespace)::isNullableAndMutable(Expression *, Index)");
}

Assistant:

bool isNullableAndMutable(Expression* ref, Index fieldIndex) {
  // Find the field for the given reference, and check its properties.
  auto field = GCTypeUtils::getField(ref->type, fieldIndex);
  assert(field);
  return field->type.isNullable() && field->mutable_ == Mutable;
}